

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlParser.cpp
# Opt level: O3

void __thiscall KDReports::Test::testHandler(Test *this)

{
  QStringView QVar1;
  QStringView QVar2;
  QStringView QVar3;
  QStringView QVar4;
  QString *str;
  qsizetype len;
  bool bVar5;
  char cVar6;
  byte bVar7;
  QStandardItem *pQVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  QByteArrayView QVar19;
  QByteArrayView QVar20;
  QByteArrayView QVar21;
  QByteArrayView QVar22;
  QByteArrayView QVar23;
  QByteArrayView QVar24;
  QByteArrayView QVar25;
  QByteArrayView QVar26;
  QByteArrayView QVar27;
  QByteArrayView QVar28;
  QByteArrayView QVar29;
  QByteArrayView QVar30;
  QByteArrayView QVar31;
  QByteArrayView QVar32;
  QByteArrayView QVar33;
  QByteArrayView QVar34;
  QByteArrayView QVar35;
  QByteArrayView QVar36;
  QByteArrayView QVar37;
  QByteArrayView QVar38;
  QByteArrayView QVar39;
  QByteArrayView QVar40;
  QByteArrayView QVar41;
  QArrayDataPointer<QString> local_428;
  QStringList expectedCallbacks;
  QArrayDataPointer<char16_t> local_3e8;
  QString ptext;
  Report report;
  QArrayDataPointer<char16_t> local_398;
  QStandardItemModel model;
  QFile file;
  QArrayDataPointer<char16_t> local_358;
  TestXmlElementHandler handler;
  QArrayDataPointer<char16_t> local_308;
  QArrayDataPointer<char16_t> local_2e8;
  QArrayDataPointer<char16_t> local_2c8;
  QArrayDataPointer<char16_t> local_2a8;
  QArrayDataPointer<char16_t> local_288;
  QArrayDataPointer<char16_t> local_268;
  QArrayDataPointer<char16_t> local_248;
  QArrayDataPointer<char16_t> local_228;
  QArrayDataPointer<char16_t> local_208;
  QArrayDataPointer<char16_t> local_1e8;
  QArrayDataPointer<char16_t> local_1c8;
  QArrayDataPointer<char16_t> local_1a8;
  QArrayDataPointer<char16_t> local_188;
  QArrayDataPointer<char16_t> local_168;
  QArrayDataPointer<char16_t> local_148;
  QArrayDataPointer<char16_t> local_128;
  QArrayDataPointer<char16_t> local_108;
  QArrayDataPointer<char16_t> local_e8;
  QArrayDataPointer<char16_t> local_c8;
  QArrayDataPointer<char16_t> local_a8;
  QArrayDataPointer<char16_t> local_88;
  QArrayDataPointer<char16_t> local_68;
  QByteArrayView local_48;
  char *local_38;
  
  expectedCallbacks.d.d = (Data *)anon_var_dwarf_f92a;
  QByteArrayView::QByteArrayView<const_char_*,_true>
            ((QByteArrayView *)&report,(char **)&expectedCallbacks);
  QVar9.m_data = _report;
  QVar9.m_size = (qsizetype)&handler;
  QString::fromUtf8(QVar9);
  local_428.ptr = (QString *)handler._8_8_;
  local_428.d = (Data *)handler._0_8_;
  handler.super_XmlElementHandler = (XmlElementHandler)0x0;
  handler._1_7_ = 0;
  handler._8_8_ = 0;
  local_428.size = (qsizetype)handler.cb.d.d;
  handler.cb.d.d = (Data *)0x0;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&handler);
  QFile::QFile(&file,(QString *)&local_428);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_428);
  bVar5 = (bool)QFile::open(&file,1);
  cVar6 = QTest::qVerify(bVar5,"file.open(QIODevice::ReadOnly)","",
                         "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                         ,0xf1);
  if (cVar6 != '\0') {
    KDReports::Report::Report(&report,(QObject *)0x0);
    TestXmlElementHandler::TestXmlElementHandler(&handler,&report);
    KDReports::Report::setXmlElementHandler((XmlElementHandler *)&report);
    QStandardItemModel::QStandardItemModel(&model,(QObject *)0x0);
    pQVar8 = (QStandardItem *)operator_new(0x10);
    local_3e8.d = (Data *)0x1110b1;
    QByteArrayView::QByteArrayView<const_char_*,_true>((QByteArrayView *)&ptext,(char **)&local_3e8)
    ;
    QVar10.m_data = (storage_type *)ptext.d.d;
    QVar10.m_size = (qsizetype)&local_428;
    QString::fromUtf8(QVar10);
    expectedCallbacks.d.ptr = local_428.ptr;
    expectedCallbacks.d.d = local_428.d;
    local_428.d = (Data *)0x0;
    local_428.ptr = (QString *)0x0;
    expectedCallbacks.d.size = local_428.size;
    local_428.size = 0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_428);
    QStandardItem::QStandardItem(pQVar8,(QString *)&expectedCallbacks);
    QStandardItemModel::setItem((int)&model,0,(QStandardItem *)0x0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)&expectedCallbacks);
    pQVar8 = (QStandardItem *)operator_new(0x10);
    local_3e8.d = (Data *)0x1110bb;
    QByteArrayView::QByteArrayView<const_char_*,_true>((QByteArrayView *)&ptext,(char **)&local_3e8)
    ;
    QVar11.m_data = (storage_type *)ptext.d.d;
    QVar11.m_size = (qsizetype)&local_428;
    QString::fromUtf8(QVar11);
    expectedCallbacks.d.ptr = local_428.ptr;
    expectedCallbacks.d.d = local_428.d;
    local_428.d = (Data *)0x0;
    local_428.ptr = (QString *)0x0;
    expectedCallbacks.d.size = local_428.size;
    local_428.size = 0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_428);
    QStandardItem::QStandardItem(pQVar8,(QString *)&expectedCallbacks);
    QStandardItemModel::setItem((int)&model,0,(QStandardItem *)0x1);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)&expectedCallbacks);
    local_3e8.d = (Data *)0x1110d1;
    QByteArrayView::QByteArrayView<const_char_*,_true>((QByteArrayView *)&ptext,(char **)&local_3e8)
    ;
    QVar12.m_data = (storage_type *)ptext.d.d;
    QVar12.m_size = (qsizetype)&local_428;
    QString::fromUtf8(QVar12);
    expectedCallbacks.d.ptr = local_428.ptr;
    expectedCallbacks.d.d = local_428.d;
    local_428.d = (Data *)0x0;
    local_428.ptr = (QString *)0x0;
    expectedCallbacks.d.size = local_428.size;
    local_428.size = 0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_428);
    KDReports::Report::associateModel((QString *)&report,(QAbstractItemModel *)&expectedCallbacks);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)&expectedCallbacks);
    local_3e8.d = (Data *)0x1110d8;
    QByteArrayView::QByteArrayView<const_char_*,_true>((QByteArrayView *)&ptext,(char **)&local_3e8)
    ;
    QVar13.m_data = (storage_type *)ptext.d.d;
    QVar13.m_size = (qsizetype)&local_428;
    QString::fromUtf8(QVar13);
    expectedCallbacks.d.ptr = local_428.ptr;
    expectedCallbacks.d.d = local_428.d;
    local_428.d = (Data *)0x0;
    local_428.ptr = (QString *)0x0;
    expectedCallbacks.d.size = local_428.size;
    local_428.size = 0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_428);
    local_398.d = (Data *)0x1110e5;
    QByteArrayView::QByteArrayView<const_char_*,_true>
              ((QByteArrayView *)&local_3e8,(char **)&local_398);
    QVar14.m_data = (storage_type *)local_3e8.d;
    QVar14.m_size = (qsizetype)&local_428;
    QString::fromUtf8(QVar14);
    ptext.d.ptr = (char16_t *)local_428.ptr;
    ptext.d.d = (Data *)local_428.d;
    local_428.d = (Data *)0x0;
    local_428.ptr = (QString *)0x0;
    ptext.d.size = local_428.size;
    local_428.size = 0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_428);
    KDReports::Report::associateTextValue((QString *)&report,(QString *)&expectedCallbacks);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&ptext.d);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)&expectedCallbacks);
    bVar5 = (bool)KDReports::Report::loadFromXML((QIODevice *)&report,(ErrorDetails *)&file);
    cVar6 = QTest::qVerify(bVar5,"report.loadFromXML(&file)","",
                           "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                           ,0xff);
    if (cVar6 != '\0') {
      KDReports::XmlElementHandler::errorDetails();
      bVar7 = KDReports::ErrorDetails::hasError();
      cVar6 = QTest::qVerify((bool)(bVar7 ^ 1),"!handler.errorDetails().hasError()","",
                             "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                             ,0x100);
      KDReports::ErrorDetails::~ErrorDetails((ErrorDetails *)&local_428);
      if (cVar6 != '\0') {
        expectedCallbacks.d.d = (Data *)0x0;
        expectedCallbacks.d.ptr = (QString *)0x0;
        expectedCallbacks.d.size = 0;
        local_398.d = (Data *)0x111111;
        QByteArrayView::QByteArrayView<const_char_*,_true>
                  ((QByteArrayView *)&local_3e8,(char **)&local_398);
        QVar15.m_data = (storage_type *)local_3e8.d;
        QVar15.m_size = (qsizetype)&local_428;
        QString::fromUtf8(QVar15);
        ptext.d.ptr = (char16_t *)local_428.ptr;
        ptext.d.d = (Data *)local_428.d;
        local_428.d = (Data *)0x0;
        local_428.ptr = (QString *)0x0;
        ptext.d.size = local_428.size;
        local_428.size = 0;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_428);
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)&expectedCallbacks,expectedCallbacks.d.size,&ptext);
        local_358.d = (Data *)0x11111d;
        QByteArrayView::QByteArrayView<const_char_*,_true>
                  ((QByteArrayView *)&local_398,(char **)&local_358);
        QVar16.m_data = (storage_type *)local_398.d;
        QVar16.m_size = (qsizetype)&local_428;
        QString::fromUtf8(QVar16);
        local_3e8.ptr = (char16_t *)local_428.ptr;
        local_3e8.d = (Data *)local_428.d;
        local_428.d = (Data *)0x0;
        local_428.ptr = (QString *)0x0;
        local_3e8.size = local_428.size;
        local_428.size = 0;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_428);
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)&expectedCallbacks,expectedCallbacks.d.size,
                   (QString *)&local_3e8);
        local_68.d = (Data *)0x111129;
        QByteArrayView::QByteArrayView<const_char_*,_true>
                  ((QByteArrayView *)&local_358,(char **)&local_68);
        QVar17.m_data = (storage_type *)local_358.d;
        QVar17.m_size = (qsizetype)&local_428;
        QString::fromUtf8(QVar17);
        local_398.ptr = (char16_t *)local_428.ptr;
        local_398.d = (Data *)local_428.d;
        local_428.d = (Data *)0x0;
        local_428.ptr = (QString *)0x0;
        local_398.size = local_428.size;
        local_428.size = 0;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_428);
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)&expectedCallbacks,expectedCallbacks.d.size,
                   (QString *)&local_398);
        local_88.d = (Data *)0x111136;
        QByteArrayView::QByteArrayView<const_char_*,_true>
                  ((QByteArrayView *)&local_68,(char **)&local_88);
        QVar18.m_data = (storage_type *)local_68.d;
        QVar18.m_size = (qsizetype)&local_428;
        QString::fromUtf8(QVar18);
        local_358.ptr = (char16_t *)local_428.ptr;
        local_358.d = (Data *)local_428.d;
        local_428.d = (Data *)0x0;
        local_428.ptr = (QString *)0x0;
        local_358.size = local_428.size;
        local_428.size = 0;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_428);
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)&expectedCallbacks,expectedCallbacks.d.size,
                   (QString *)&local_358);
        local_a8.d = (Data *)0x11113f;
        QByteArrayView::QByteArrayView<const_char_*,_true>
                  ((QByteArrayView *)&local_88,(char **)&local_a8);
        QVar19.m_data = (storage_type *)local_88.d;
        QVar19.m_size = (qsizetype)&local_428;
        QString::fromUtf8(QVar19);
        local_68.ptr = (char16_t *)local_428.ptr;
        local_68.d = (Data *)local_428.d;
        local_428.d = (Data *)0x0;
        local_428.ptr = (QString *)0x0;
        local_68.size = local_428.size;
        local_428.size = 0;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_428);
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)&expectedCallbacks,expectedCallbacks.d.size,
                   (QString *)&local_68);
        local_c8.d = (Data *)0x111149;
        QByteArrayView::QByteArrayView<const_char_*,_true>
                  ((QByteArrayView *)&local_a8,(char **)&local_c8);
        QVar20.m_data = (storage_type *)local_a8.d;
        QVar20.m_size = (qsizetype)&local_428;
        QString::fromUtf8(QVar20);
        local_88.ptr = (char16_t *)local_428.ptr;
        local_88.d = (Data *)local_428.d;
        local_428.d = (Data *)0x0;
        local_428.ptr = (QString *)0x0;
        local_88.size = local_428.size;
        local_428.size = 0;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_428);
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)&expectedCallbacks,expectedCallbacks.d.size,
                   (QString *)&local_88);
        local_e8.d = (Data *)0x111155;
        QByteArrayView::QByteArrayView<const_char_*,_true>
                  ((QByteArrayView *)&local_c8,(char **)&local_e8);
        QVar21.m_data = (storage_type *)local_c8.d;
        QVar21.m_size = (qsizetype)&local_428;
        QString::fromUtf8(QVar21);
        local_a8.ptr = (char16_t *)local_428.ptr;
        local_a8.d = (Data *)local_428.d;
        local_428.d = (Data *)0x0;
        local_428.ptr = (QString *)0x0;
        local_a8.size = local_428.size;
        local_428.size = 0;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_428);
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)&expectedCallbacks,expectedCallbacks.d.size,
                   (QString *)&local_a8);
        local_108.d = (Data *)0x111161;
        QByteArrayView::QByteArrayView<const_char_*,_true>
                  ((QByteArrayView *)&local_e8,(char **)&local_108);
        QVar22.m_data = (storage_type *)local_e8.d;
        QVar22.m_size = (qsizetype)&local_428;
        QString::fromUtf8(QVar22);
        local_c8.ptr = (char16_t *)local_428.ptr;
        local_c8.d = (Data *)local_428.d;
        local_428.d = (Data *)0x0;
        local_428.ptr = (QString *)0x0;
        local_c8.size = local_428.size;
        local_428.size = 0;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_428);
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)&expectedCallbacks,expectedCallbacks.d.size,
                   (QString *)&local_c8);
        local_128.d = (Data *)0x11116b;
        QByteArrayView::QByteArrayView<const_char_*,_true>
                  ((QByteArrayView *)&local_108,(char **)&local_128);
        QVar23.m_data = (storage_type *)local_108.d;
        QVar23.m_size = (qsizetype)&local_428;
        QString::fromUtf8(QVar23);
        local_e8.ptr = (char16_t *)local_428.ptr;
        local_e8.d = (Data *)local_428.d;
        local_428.d = (Data *)0x0;
        local_428.ptr = (QString *)0x0;
        local_e8.size = local_428.size;
        local_428.size = 0;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_428);
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)&expectedCallbacks,expectedCallbacks.d.size,
                   (QString *)&local_e8);
        local_148.d = (Data *)0x111170;
        QByteArrayView::QByteArrayView<const_char_*,_true>
                  ((QByteArrayView *)&local_128,(char **)&local_148);
        QVar24.m_data = (storage_type *)local_128.d;
        QVar24.m_size = (qsizetype)&local_428;
        QString::fromUtf8(QVar24);
        local_108.ptr = (char16_t *)local_428.ptr;
        local_108.d = (Data *)local_428.d;
        local_428.d = (Data *)0x0;
        local_428.ptr = (QString *)0x0;
        local_108.size = local_428.size;
        local_428.size = 0;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_428);
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)&expectedCallbacks,expectedCallbacks.d.size,
                   (QString *)&local_108);
        local_168.d = (Data *)0x111155;
        QByteArrayView::QByteArrayView<const_char_*,_true>
                  ((QByteArrayView *)&local_148,(char **)&local_168);
        QVar25.m_data = (storage_type *)local_148.d;
        QVar25.m_size = (qsizetype)&local_428;
        QString::fromUtf8(QVar25);
        local_128.ptr = (char16_t *)local_428.ptr;
        local_128.d = (Data *)local_428.d;
        local_428.d = (Data *)0x0;
        local_428.ptr = (QString *)0x0;
        local_128.size = local_428.size;
        local_428.size = 0;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_428);
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)&expectedCallbacks,expectedCallbacks.d.size,
                   (QString *)&local_128);
        local_188.d = (Data *)0x111155;
        QByteArrayView::QByteArrayView<const_char_*,_true>
                  ((QByteArrayView *)&local_168,(char **)&local_188);
        QVar26.m_data = (storage_type *)local_168.d;
        QVar26.m_size = (qsizetype)&local_428;
        QString::fromUtf8(QVar26);
        local_148.ptr = (char16_t *)local_428.ptr;
        local_148.d = (Data *)local_428.d;
        local_428.d = (Data *)0x0;
        local_428.ptr = (QString *)0x0;
        local_148.size = local_428.size;
        local_428.size = 0;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_428);
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)&expectedCallbacks,expectedCallbacks.d.size,
                   (QString *)&local_148);
        local_1a8.d = (Data *)0x111182;
        QByteArrayView::QByteArrayView<const_char_*,_true>
                  ((QByteArrayView *)&local_188,(char **)&local_1a8);
        QVar27.m_data = (storage_type *)local_188.d;
        QVar27.m_size = (qsizetype)&local_428;
        QString::fromUtf8(QVar27);
        local_168.ptr = (char16_t *)local_428.ptr;
        local_168.d = (Data *)local_428.d;
        local_428.d = (Data *)0x0;
        local_428.ptr = (QString *)0x0;
        local_168.size = local_428.size;
        local_428.size = 0;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_428);
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)&expectedCallbacks,expectedCallbacks.d.size,
                   (QString *)&local_168);
        local_1c8.d = (Data *)0x11118f;
        QByteArrayView::QByteArrayView<const_char_*,_true>
                  ((QByteArrayView *)&local_1a8,(char **)&local_1c8);
        QVar28.m_data = (storage_type *)local_1a8.d;
        QVar28.m_size = (qsizetype)&local_428;
        QString::fromUtf8(QVar28);
        local_188.ptr = (char16_t *)local_428.ptr;
        local_188.d = (Data *)local_428.d;
        local_428.d = (Data *)0x0;
        local_428.ptr = (QString *)0x0;
        local_188.size = local_428.size;
        local_428.size = 0;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_428);
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)&expectedCallbacks,expectedCallbacks.d.size,
                   (QString *)&local_188);
        local_1e8.d = (Data *)0x111196;
        QByteArrayView::QByteArrayView<const_char_*,_true>
                  ((QByteArrayView *)&local_1c8,(char **)&local_1e8);
        QVar29.m_data = (storage_type *)local_1c8.d;
        QVar29.m_size = (qsizetype)&local_428;
        QString::fromUtf8(QVar29);
        local_1a8.ptr = (char16_t *)local_428.ptr;
        local_1a8.d = (Data *)local_428.d;
        local_428.d = (Data *)0x0;
        local_428.ptr = (QString *)0x0;
        local_1a8.size = local_428.size;
        local_428.size = 0;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_428);
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)&expectedCallbacks,expectedCallbacks.d.size,
                   (QString *)&local_1a8);
        local_208.d = (Data *)0x111155;
        QByteArrayView::QByteArrayView<const_char_*,_true>
                  ((QByteArrayView *)&local_1e8,(char **)&local_208);
        QVar30.m_data = (storage_type *)local_1e8.d;
        QVar30.m_size = (qsizetype)&local_428;
        QString::fromUtf8(QVar30);
        local_1c8.ptr = (char16_t *)local_428.ptr;
        local_1c8.d = (Data *)local_428.d;
        local_428.d = (Data *)0x0;
        local_428.ptr = (QString *)0x0;
        local_1c8.size = local_428.size;
        local_428.size = 0;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_428);
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)&expectedCallbacks,expectedCallbacks.d.size,
                   (QString *)&local_1c8);
        local_228.d = (Data *)0x111196;
        QByteArrayView::QByteArrayView<const_char_*,_true>
                  ((QByteArrayView *)&local_208,(char **)&local_228);
        QVar31.m_data = (storage_type *)local_208.d;
        QVar31.m_size = (qsizetype)&local_428;
        QString::fromUtf8(QVar31);
        local_1e8.ptr = (char16_t *)local_428.ptr;
        local_1e8.d = (Data *)local_428.d;
        local_428.d = (Data *)0x0;
        local_428.ptr = (QString *)0x0;
        local_1e8.size = local_428.size;
        local_428.size = 0;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_428);
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)&expectedCallbacks,expectedCallbacks.d.size,
                   (QString *)&local_1e8);
        local_248.d = (Data *)0x1111a2;
        QByteArrayView::QByteArrayView<const_char_*,_true>
                  ((QByteArrayView *)&local_228,(char **)&local_248);
        QVar32.m_data = (storage_type *)local_228.d;
        QVar32.m_size = (qsizetype)&local_428;
        QString::fromUtf8(QVar32);
        local_208.ptr = (char16_t *)local_428.ptr;
        local_208.d = (Data *)local_428.d;
        local_428.d = (Data *)0x0;
        local_428.ptr = (QString *)0x0;
        local_208.size = local_428.size;
        local_428.size = 0;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_428);
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)&expectedCallbacks,expectedCallbacks.d.size,
                   (QString *)&local_208);
        local_268.d = (Data *)0x1111b4;
        QByteArrayView::QByteArrayView<const_char_*,_true>
                  ((QByteArrayView *)&local_248,(char **)&local_268);
        QVar33.m_data = (storage_type *)local_248.d;
        QVar33.m_size = (qsizetype)&local_428;
        QString::fromUtf8(QVar33);
        local_228.ptr = (char16_t *)local_428.ptr;
        local_228.d = (Data *)local_428.d;
        local_428.d = (Data *)0x0;
        local_428.ptr = (QString *)0x0;
        local_228.size = local_428.size;
        local_428.size = 0;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_428);
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)&expectedCallbacks,expectedCallbacks.d.size,
                   (QString *)&local_228);
        local_288.d = (Data *)0x111155;
        QByteArrayView::QByteArrayView<const_char_*,_true>
                  ((QByteArrayView *)&local_268,(char **)&local_288);
        QVar34.m_data = (storage_type *)local_268.d;
        QVar34.m_size = (qsizetype)&local_428;
        QString::fromUtf8(QVar34);
        local_248.ptr = (char16_t *)local_428.ptr;
        local_248.d = (Data *)local_428.d;
        local_428.d = (Data *)0x0;
        local_428.ptr = (QString *)0x0;
        local_248.size = local_428.size;
        local_428.size = 0;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_428);
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)&expectedCallbacks,expectedCallbacks.d.size,
                   (QString *)&local_248);
        local_2a8.d = (Data *)0x1111be;
        QByteArrayView::QByteArrayView<const_char_*,_true>
                  ((QByteArrayView *)&local_288,(char **)&local_2a8);
        QVar35.m_data = (storage_type *)local_288.d;
        QVar35.m_size = (qsizetype)&local_428;
        QString::fromUtf8(QVar35);
        local_268.ptr = (char16_t *)local_428.ptr;
        local_268.d = (Data *)local_428.d;
        local_428.d = (Data *)0x0;
        local_428.ptr = (QString *)0x0;
        local_268.size = local_428.size;
        local_428.size = 0;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_428);
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)&expectedCallbacks,expectedCallbacks.d.size,
                   (QString *)&local_268);
        local_2c8.d = (Data *)0x1111c6;
        QByteArrayView::QByteArrayView<const_char_*,_true>
                  ((QByteArrayView *)&local_2a8,(char **)&local_2c8);
        QVar36.m_data = (storage_type *)local_2a8.d;
        QVar36.m_size = (qsizetype)&local_428;
        QString::fromUtf8(QVar36);
        local_288.ptr = (char16_t *)local_428.ptr;
        local_288.d = (Data *)local_428.d;
        local_428.d = (Data *)0x0;
        local_428.ptr = (QString *)0x0;
        local_288.size = local_428.size;
        local_428.size = 0;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_428);
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)&expectedCallbacks,expectedCallbacks.d.size,
                   (QString *)&local_288);
        local_2e8.d = (Data *)0x111155;
        QByteArrayView::QByteArrayView<const_char_*,_true>
                  ((QByteArrayView *)&local_2c8,(char **)&local_2e8);
        QVar37.m_data = (storage_type *)local_2c8.d;
        QVar37.m_size = (qsizetype)&local_428;
        QString::fromUtf8(QVar37);
        local_2a8.ptr = (char16_t *)local_428.ptr;
        local_2a8.d = (Data *)local_428.d;
        local_428.d = (Data *)0x0;
        local_428.ptr = (QString *)0x0;
        local_2a8.size = local_428.size;
        local_428.size = 0;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_428);
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)&expectedCallbacks,expectedCallbacks.d.size,
                   (QString *)&local_2a8);
        local_308.d = (Data *)0x1111d6;
        QByteArrayView::QByteArrayView<const_char_*,_true>
                  ((QByteArrayView *)&local_2e8,(char **)&local_308);
        QVar38.m_data = (storage_type *)local_2e8.d;
        QVar38.m_size = (qsizetype)&local_428;
        QString::fromUtf8(QVar38);
        local_2c8.ptr = (char16_t *)local_428.ptr;
        local_2c8.d = (Data *)local_428.d;
        local_428.d = (Data *)0x0;
        local_428.ptr = (QString *)0x0;
        local_2c8.size = local_428.size;
        local_428.size = 0;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_428);
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)&expectedCallbacks,expectedCallbacks.d.size,
                   (QString *)&local_2c8);
        local_48.m_size = 0x1111e4;
        QByteArrayView::QByteArrayView<const_char_*,_true>
                  ((QByteArrayView *)&local_308,(char **)&local_48);
        QVar39.m_data = (storage_type *)local_308.d;
        QVar39.m_size = (qsizetype)&local_428;
        QString::fromUtf8(QVar39);
        local_2e8.ptr = (char16_t *)local_428.ptr;
        local_2e8.d = (Data *)local_428.d;
        local_428.d = (Data *)0x0;
        local_428.ptr = (QString *)0x0;
        local_2e8.size = local_428.size;
        local_428.size = 0;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_428);
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)&expectedCallbacks,expectedCallbacks.d.size,
                   (QString *)&local_2e8);
        local_38 = "endReport";
        QByteArrayView::QByteArrayView<const_char_*,_true>(&local_48,&local_38);
        QVar40.m_data = (storage_type *)local_48.m_size;
        QVar40.m_size = (qsizetype)&local_428;
        QString::fromUtf8(QVar40);
        local_308.ptr = (char16_t *)local_428.ptr;
        local_308.d = (Data *)local_428.d;
        local_428.d = (Data *)0x0;
        local_428.ptr = (QString *)0x0;
        local_308.size = local_428.size;
        local_428.size = 0;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_428);
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)&expectedCallbacks,expectedCallbacks.d.size,
                   (QString *)&local_308);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_308);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_2e8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_2c8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_2a8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_288);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_268);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_248);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_228);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_208);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1e8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1a8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_188);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_168);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_148);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_128);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_108);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_358);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_398);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_3e8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&ptext.d);
        local_428.d = handler.cb.d.d;
        local_428.ptr = handler.cb.d.ptr;
        local_428.size = handler.cb.d.size;
        if (handler.cb.d.d != (Data *)0x0) {
          LOCK();
          ((handler.cb.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((handler.cb.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        bVar5 = QTest::
                _q_compareSequence<QList<QString>::const_iterator,QList<QString>::const_iterator>
                          ((const_iterator)handler.cb.d.ptr,handler.cb.d.ptr + handler.cb.d.size,
                           (const_iterator)expectedCallbacks.d.ptr,
                           expectedCallbacks.d.ptr + expectedCallbacks.d.size,"handler.callbacks()",
                           "expectedCallbacks",
                           "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                           ,0x11d);
        QArrayDataPointer<QString>::~QArrayDataPointer(&local_428);
        if (bVar5) {
          KDReports::Report::mainTextDocument();
          QTextDocument::toPlainText();
          QString::replace((QChar)(char16_t)&ptext,(QChar)0xfffc,0x23);
          local_358.d = (Data *)0x111225;
          QByteArrayView::QByteArrayView<const_char_*,_true>
                    ((QByteArrayView *)&local_398,(char **)&local_358);
          QVar41.m_data = (storage_type *)local_398.d;
          QVar41.m_size = (qsizetype)&local_428;
          QString::fromUtf8(QVar41);
          len = local_428.size;
          str = local_428.ptr;
          local_3e8.d = (Data *)local_428.d;
          local_428.d = (Data *)0x0;
          local_3e8.ptr = (char16_t *)local_428.ptr;
          local_428.ptr = (QString *)0x0;
          local_428.size = 0;
          local_3e8.size = len;
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_428)
          ;
          QStringView::QStringView<QChar,_true>
                    ((QStringView *)&local_428,(QChar *)ptext.d.ptr,ptext.d.size);
          QStringView::QStringView<QChar,_true>((QStringView *)&local_398,(QChar *)str,len);
          QVar1.m_data = (storage_type_conflict *)local_428.ptr;
          QVar1.m_size = (qsizetype)local_428.d;
          QVar2.m_data = local_398.ptr;
          QVar2.m_size = (qsizetype)local_398.d;
          cVar6 = QTest::qCompare(QVar1,QVar2,"ptext",
                                  "QString(\"Title\\n#\\n \\nTest used by XmlParser.cpp\\nmodelCell\\nhtmlCell\\n\\nTableElement example\\n\\nmodified\\nCustom element\\n\\nmodelCell\\nhtmlCell\\n\")"
                                  ,
                                  "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                                  ,0x126);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_3e8);
          if (cVar6 != '\0') {
            KDReports::Report::mainTextDocument();
            QTextDocument::toPlainText();
            QTextDocument::toPlainText();
            QStringView::QStringView<QChar,_true>
                      ((QStringView *)&local_398,(QChar *)local_428.ptr,local_428.size);
            QStringView::QStringView<QChar,_true>
                      ((QStringView *)&local_358,(QChar *)local_3e8.ptr,local_3e8.size);
            QVar3.m_data = local_398.ptr;
            QVar3.m_size = (qsizetype)local_398.d;
            QVar4.m_data = local_358.ptr;
            QVar4.m_size = (qsizetype)local_358.d;
            QTest::qCompare(QVar3,QVar4,"report.mainTextDocument()->toPlainText()",
                            "doc.toPlainText()",
                            "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                            ,0x127);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_3e8);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_428);
          }
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&ptext.d);
        }
        QArrayDataPointer<QString>::~QArrayDataPointer(&expectedCallbacks.d);
      }
    }
    QStandardItemModel::~QStandardItemModel(&model);
    handler._0_8_ = &PTR__TestXmlElementHandler_0011dc20;
    QArrayDataPointer<QString>::~QArrayDataPointer(&handler.cb.d);
    KDReports::XmlElementHandler::~XmlElementHandler(&handler.super_XmlElementHandler);
    KDReports::Report::~Report(&report);
  }
  QFile::~QFile(&file);
  return;
}

Assistant:

void testHandler()
    {
        QFile file(":/handler.xml");
        QVERIFY(file.open(QIODevice::ReadOnly));
        Report report;
        TestXmlElementHandler handler(report);
        report.setXmlElementHandler(&handler);

        QStandardItemModel model;
        model.setItem(0, 0, new QStandardItem("modelCell"));
        // HTML cells need to start with "<html>" for KDReportsAutoTable
        // (not necessary if it's just for <html model="..." row="..." column="...">)
        model.setItem(0, 1, new QStandardItem("<html><b>htmlCell</b>"));
        report.associateModel("model1", &model);

        report.associateTextValue("testModified", "modified");

        QVERIFY(report.loadFromXML(&file));
        QVERIFY(!handler.errorDetails().hasError());
        QStringList expectedCallbacks;
        expectedCallbacks << "startReport"
                          << "startHeader"
                          << "imageElement"
                          << "variable"
                          << "endHeader"
                          << "startFooter"
                          << "textElement"
                          << "endFooter"
                          << "tabs"
                          << "paragraph-margins"
                          << "textElement"
                          << "textElement"
                          << "hLineElement"
                          << "vspace"
                          << "htmlElement"
                          << "textElement"
                          << "htmlElement"
                          << "startTableElement"
                          << "startCell"
                          << "textElement"
                          << "endCell"
                          << "endTableElement"
                          << "textElement"
                          << "customElement"
                          << "autoTableElement"
                          << "endReport";
        // qDebug() << handler.callbacks();
        QCOMPARE(handler.callbacks(), expectedCallbacks);
        QTextDocument &doc = *report.mainTextDocument();

        QString ptext = doc.toPlainText();

        // custom objects (such as HLineTextObject) are represented
        // as 0xFFFC
        ptext.replace(QChar(0xFFFC), '#');

        QCOMPARE(ptext, QString("Title\n#\n \nTest used by XmlParser.cpp\nmodelCell\nhtmlCell\n\nTableElement example\n\nmodified\nCustom element\n\nmodelCell\nhtmlCell\n"));
        QCOMPARE(report.mainTextDocument()->toPlainText(), doc.toPlainText());
    }